

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  GLFWmonitor **ppGVar6;
  undefined8 *puVar7;
  GLFWwindow *pGVar8;
  GLFWmonitor *monitor;
  char *pcVar9;
  ulong __nmemb;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  int monitor_count;
  int local_3c;
  ulong local_38;
  
  iVar5 = 1;
  bVar1 = false;
  bVar3 = false;
LAB_00106c44:
  while( true ) {
    do {
      bVar2 = bVar3;
      iVar4 = getopt(argc,argv,"afhn");
      bVar3 = true;
    } while (iVar4 == 0x61);
    if (iVar4 < 0x68) break;
    if (iVar4 != 0x6e) {
      if (iVar4 == 0x68) {
        usage();
LAB_00106e73:
        exit(0);
      }
      goto LAB_00106d0a;
    }
    iVar5 = 0;
    bVar3 = bVar2;
  }
  if (iVar4 == 0x66) {
    bVar1 = true;
    bVar3 = bVar2;
    goto LAB_00106c44;
  }
  if (iVar4 != -1) {
LAB_00106d0a:
    usage();
LAB_00106d0f:
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  iVar4 = glfwInit();
  if (iVar4 == 0) goto LAB_00106d0f;
  glfwWindowHint(0x20006,iVar5);
  if (bVar2 && bVar1) {
    ppGVar6 = glfwGetMonitors(&local_3c);
    __nmemb = (ulong)local_3c;
    puVar7 = (undefined8 *)calloc(__nmemb,8);
    if ((long)__nmemb < 1) {
      bVar1 = false;
      goto LAB_00106e38;
    }
    lVar12 = 0;
    do {
      pGVar8 = create_window(ppGVar6[lVar12]);
      puVar7[lVar12] = pGVar8;
      lVar12 = lVar12 + 1;
    } while (lVar12 < local_3c);
  }
  else {
    if (bVar1) {
      monitor = glfwGetPrimaryMonitor();
    }
    else {
      monitor = (GLFWmonitor *)0x0;
    }
    puVar7 = (undefined8 *)calloc(1,8);
    pGVar8 = create_window(monitor);
    *puVar7 = pGVar8;
    __nmemb = 1;
  }
  uVar11 = 0;
  local_38 = __nmemb;
  do {
    glfwSetKeyCallback((GLFWwindow *)puVar7[uVar11],key_callback);
    glfwSetFramebufferSizeCallback((GLFWwindow *)puVar7[uVar11],framebuffer_size_callback);
    glfwSetWindowSizeCallback((GLFWwindow *)puVar7[uVar11],window_size_callback);
    glfwSetWindowFocusCallback((GLFWwindow *)puVar7[uVar11],window_focus_callback);
    glfwSetWindowIconifyCallback((GLFWwindow *)puVar7[uVar11],window_iconify_callback);
    glfwSetWindowRefreshCallback((GLFWwindow *)puVar7[uVar11],window_refresh_callback);
    window_refresh_callback((GLFWwindow *)puVar7[uVar11]);
    iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar11],0x20002);
    pcVar10 = "iconified";
    if (iVar5 == 0) {
      pcVar10 = "restored";
    }
    iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar11],0x20001);
    pcVar9 = "focused";
    if (iVar5 == 0) {
      pcVar9 = "defocused";
    }
    printf("Window is %s and %s\n",pcVar10,pcVar9);
    uVar11 = uVar11 + 1;
  } while ((__nmemb & 0xffffffff) != uVar11);
  bVar1 = true;
  __nmemb = local_38;
LAB_00106e38:
  do {
    glfwPollEvents();
    if (bVar1) {
      uVar11 = 0;
      do {
        iVar5 = glfwWindowShouldClose((GLFWwindow *)puVar7[uVar11]);
        if (iVar5 != 0) {
          glfwTerminate();
          goto LAB_00106e73;
        }
        uVar11 = uVar11 + 1;
      } while ((__nmemb & 0xffffffff) != uVar11);
    }
    fflush(_stdout);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    GLboolean auto_iconify = GL_TRUE, fullscreen = GL_FALSE, all_monitors = GL_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GL_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GL_TRUE;
                break;

            case 'n':
                auto_iconify = GL_FALSE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_AUTO_ICONIFY, auto_iconify);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwPollEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}